

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snapshot.cpp
# Opt level: O0

RealType __thiscall OpenMD::Snapshot::getPotentialEnergy(Snapshot *this)

{
  Snapshot *in_RDI;
  RealType RVar1;
  
  if ((in_RDI->hasPotentialEnergy & 1U) == 0) {
    RVar1 = getLongRangePotential(in_RDI);
    (in_RDI->frameData).potentialEnergy = RVar1;
    RVar1 = getShortRangePotential(in_RDI);
    (in_RDI->frameData).potentialEnergy = RVar1 + (in_RDI->frameData).potentialEnergy;
    RVar1 = getSelfPotential(in_RDI);
    (in_RDI->frameData).potentialEnergy = RVar1 + (in_RDI->frameData).potentialEnergy;
    RVar1 = getExcludedPotential(in_RDI);
    (in_RDI->frameData).potentialEnergy = RVar1 + (in_RDI->frameData).potentialEnergy;
    in_RDI->hasPotentialEnergy = true;
    in_RDI->hasTotalEnergy = false;
  }
  return (in_RDI->frameData).potentialEnergy;
}

Assistant:

RealType Snapshot::getPotentialEnergy() {
    if (!hasPotentialEnergy) {
      frameData.potentialEnergy = this->getLongRangePotential();
      frameData.potentialEnergy += this->getShortRangePotential();
      frameData.potentialEnergy += this->getSelfPotential();
      frameData.potentialEnergy += this->getExcludedPotential();
      hasPotentialEnergy = true;
      hasTotalEnergy     = false;
    }
    return frameData.potentialEnergy;
  }